

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

bool __thiscall
bloaty::RangeSink::IsVerboseForFileRange(RangeSink *this,uint64_t fileoff,uint64_t filesize)

{
  _Rb_tree_header *p_Var1;
  uint64_t vmaddr;
  bool bVar2;
  uint64_t uVar3;
  const_iterator iter;
  bool bVar4;
  Arg *in_R9;
  string_view format;
  allocator<char> local_b1;
  string local_b0;
  RangeMap vm_map;
  RangeMap file_map;
  
  if (filesize == 0xffffffffffffffff) {
    filesize = ~fileoff;
  }
  if (filesize <= ~fileoff) {
    bVar2 = ContainsVerboseFileOffset(this,fileoff,filesize);
    bVar4 = true;
    if (!bVar2) {
      if ((this->translator_ == (DualMap *)0x0) ||
         (((this->options_)._has_bits_.has_bits_[0] & 0x40) == 0)) {
        bVar4 = false;
      }
      else {
        p_Var1 = &vm_map.mappings_._M_t._M_impl.super__Rb_tree_header;
        vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header;
        file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,anon_var_dwarf_350436 + 0x11,&local_b1);
        RangeMap::AddRangeWithTranslation
                  (&file_map,fileoff,filesize,&local_b0,&this->translator_->file_map,false,&vm_map);
        std::__cxx11::string::~string((string *)&local_b0);
        bVar4 = false;
        for (iter._M_node = vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)iter._M_node != p_Var1;
            iter._M_node = (_Base_ptr)std::_Rb_tree_increment(iter._M_node)) {
          vmaddr = *(uint64_t *)(iter._M_node + 1);
          uVar3 = RangeMap::RangeEnd(&vm_map,iter);
          bVar2 = ContainsVerboseVMAddr(this,vmaddr,uVar3 - *(long *)(iter._M_node + 1));
          bVar4 = (bool)(bVar4 | bVar2);
        }
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
                     *)&file_map);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>,_std::_Select1st<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>_>
                     *)&vm_map);
      }
    }
    return bVar4;
  }
  absl::substitute_internal::Arg::Arg((Arg *)&vm_map,fileoff);
  absl::substitute_internal::Arg::Arg((Arg *)&file_map,filesize);
  format._M_str = (char *)&vm_map;
  format._M_len = (size_t)"Overflow in file range, fileoff=$0, filesize=$1";
  absl::Substitute_abi_cxx11_(&local_b0,(absl *)0x2f,format,(Arg *)&file_map,in_R9);
  Throw(local_b0._M_dataplus._M_p,0x479);
}

Assistant:

bool RangeSink::IsVerboseForFileRange(uint64_t fileoff, uint64_t filesize) {
  if (filesize == RangeMap::kUnknownSize) {
    filesize = UINT64_MAX - fileoff;
  }

  if (fileoff + filesize < fileoff) {
    THROWF("Overflow in file range, fileoff=$0, filesize=$1", fileoff,
           filesize);
  }

  if (ContainsVerboseFileOffset(fileoff, filesize)) {
    return true;
  }

  if (translator_ && options_.has_debug_vmaddr()) {
    RangeMap vm_map;
    RangeMap file_map;
    bool contains = false;
    file_map.AddRangeWithTranslation(fileoff, filesize, "",
                                     translator_->file_map, false, &vm_map);
    vm_map.ForEachRange([this, &contains](uint64_t vmaddr, uint64_t vmsize) {
      if (ContainsVerboseVMAddr(vmaddr, vmsize)) {
        contains = true;
      }
    });
    return contains;
  }

  return false;
}